

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS translate(REF_MPI ref_mpi,int argc,char **argv)

{
  double dVar1;
  REF_NODE pRVar2;
  REF_DBL RVar3;
  uint uVar4;
  REF_STATUS RVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  REF_DBL local_270;
  REF_DBL local_268;
  double local_260;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rxs_11;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_INT nodes [27];
  int local_194;
  REF_INT node_3;
  REF_INT cell;
  REF_INT group_1;
  REF_INT faceid;
  REF_NODE ref_node_3;
  REF_CELL ref_cell_1;
  REF_DBL total_deviation;
  REF_DBL deviation;
  uint local_160;
  REF_STATUS ref_private_macro_code_rxs_10;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_GRID_conflict twod_grid_1;
  uint local_148;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_INT n_planes;
  REF_GRID_conflict twod_grid;
  REF_STATUS ref_private_macro_code_rxs_9;
  REF_STATUS ref_private_macro_code_rxs_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rxs_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rxs_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rxs_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rxs_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_CELL ref_cell;
  REF_INT group;
  REF_STATUS ref_private_macro_code_rxs_3;
  REF_DBL z;
  REF_DBL y;
  REF_DBL x;
  REF_NODE pRStack_d8;
  REF_INT node_2;
  REF_NODE ref_node_2;
  REF_DBL rad;
  REF_DBL degree;
  char *endptr_2;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_INT node_1;
  REF_NODE ref_node_1;
  REF_DBL dz;
  REF_DBL dy;
  REF_DBL dx;
  char *endptr_1;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_INT node;
  REF_NODE ref_node;
  REF_DBL scale;
  char *endptr;
  uint local_60;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  size_t end_of_string;
  int local_48;
  REF_BOOL surface_only;
  REF_BOOL extrude;
  REF_INT pos;
  REF_GRID_conflict ref_grid;
  char *in_file;
  char *out_file;
  char **argv_local;
  REF_MPI pRStack_18;
  int argc_local;
  REF_MPI ref_mpi_local;
  
  _extrude = (REF_GRID)0x0;
  local_48 = 0;
  end_of_string._4_4_ = 0;
  out_file = (char *)argv;
  argv_local._4_4_ = argc;
  pRStack_18 = ref_mpi;
  if (3 < argc) {
    ref_grid = (REF_GRID_conflict)argv[2];
    in_file = argv[3];
    ref_mpi_stopwatch_start(ref_mpi);
    if (pRStack_18->n < 2) {
      if (pRStack_18->id == 0) {
        printf("import %s\n",ref_grid);
      }
      local_60 = ref_import_by_extension((REF_GRID *)&extrude,pRStack_18,(char *)ref_grid);
      if (local_60 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x106d,"translate",(ulong)local_60,"import");
        return local_60;
      }
      ref_mpi_stopwatch_stop(pRStack_18,"import");
    }
    else {
      if (pRStack_18->id == 0) {
        printf("part %s\n",ref_grid);
      }
      ref_private_macro_code_rxs =
           ref_part_by_extension((REF_GRID *)&extrude,pRStack_18,(char *)ref_grid);
      if (ref_private_macro_code_rxs != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1069,"translate",(ulong)(uint)ref_private_macro_code_rxs,"part");
        return ref_private_macro_code_rxs;
      }
      ref_mpi_stopwatch_stop(pRStack_18,"part");
    }
    if (pRStack_18->id == 0) {
      printf("  read %ld vertices\n",_extrude->node->old_n_global);
    }
    endptr._4_4_ = ref_args_find(argv_local._4_4_,(char **)out_file,"--scale",&surface_only);
    if ((endptr._4_4_ != 0) && (endptr._4_4_ != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x1074,"translate",(ulong)endptr._4_4_,"arg search");
      return endptr._4_4_;
    }
    if (surface_only != -1) {
      _ref_private_macro_code_rxs_1 = _extrude->node;
      if (argv_local._4_4_ <= surface_only + 1) {
        if (pRStack_18->id == 0) {
          printf("--scale missing scale\n");
        }
        goto LAB_00123973;
      }
      surface_only = surface_only + 1;
      ref_node = (REF_NODE)strtod(*(char **)(out_file + (long)surface_only * 8),(char **)&scale);
      if (*(REF_DBL *)(out_file + (long)surface_only * 8) == scale) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1080,"translate","parse scale");
        return 1;
      }
      if (pRStack_18->id == 0) {
        printf("--scale %e\n",ref_node);
      }
      for (endptr_1._4_4_ = 0; endptr_1._4_4_ < _ref_private_macro_code_rxs_1->max;
          endptr_1._4_4_ = endptr_1._4_4_ + 1) {
        if (((-1 < endptr_1._4_4_) && (endptr_1._4_4_ < _ref_private_macro_code_rxs_1->max)) &&
           (-1 < _ref_private_macro_code_rxs_1->global[endptr_1._4_4_])) {
          _ref_private_macro_code_rxs_1->real[endptr_1._4_4_ * 0xf] =
               (double)ref_node * _ref_private_macro_code_rxs_1->real[endptr_1._4_4_ * 0xf];
          iVar6 = endptr_1._4_4_ * 0xf + 1;
          _ref_private_macro_code_rxs_1->real[iVar6] =
               (double)ref_node * _ref_private_macro_code_rxs_1->real[iVar6];
          iVar6 = endptr_1._4_4_ * 0xf + 2;
          _ref_private_macro_code_rxs_1->real[iVar6] =
               (double)ref_node * _ref_private_macro_code_rxs_1->real[iVar6];
        }
      }
    }
    endptr_1._0_4_ = ref_args_find(argv_local._4_4_,(char **)out_file,"--shift",&surface_only);
    if (((uint)endptr_1 != 0) && ((uint)endptr_1 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x1089,"translate",(ulong)(uint)endptr_1,"arg search");
      return (uint)endptr_1;
    }
    if (surface_only != -1) {
      _ref_private_macro_code_rxs_2 = _extrude->node;
      if (argv_local._4_4_ <= surface_only + 3) {
        if (pRStack_18->id == 0) {
          printf("--shift missing dx dy dz\n");
        }
        goto LAB_00123973;
      }
      surface_only = surface_only + 1;
      dy = strtod(*(char **)(out_file + (long)surface_only * 8),(char **)&dx);
      if (*(REF_DBL *)(out_file + (long)surface_only * 8) == dx) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1095,"translate","parse dx");
        return 1;
      }
      surface_only = surface_only + 1;
      dz = strtod(*(char **)(out_file + (long)surface_only * 8),(char **)&dx);
      if (*(REF_DBL *)(out_file + (long)surface_only * 8) == dx) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1098,"translate","parse dy");
        return 1;
      }
      surface_only = surface_only + 1;
      ref_node_1 = (REF_NODE)strtod(*(char **)(out_file + (long)surface_only * 8),(char **)&dx);
      if (*(REF_DBL *)(out_file + (long)surface_only * 8) == dx) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x109b,"translate","parse dz");
        return 1;
      }
      if (pRStack_18->id == 0) {
        printf("--shift %e %e %e\n",dy,dz,ref_node_1);
      }
      for (endptr_2._4_4_ = 0; endptr_2._4_4_ < _ref_private_macro_code_rxs_2->max;
          endptr_2._4_4_ = endptr_2._4_4_ + 1) {
        if (((-1 < endptr_2._4_4_) && (endptr_2._4_4_ < _ref_private_macro_code_rxs_2->max)) &&
           (-1 < _ref_private_macro_code_rxs_2->global[endptr_2._4_4_])) {
          _ref_private_macro_code_rxs_2->real[endptr_2._4_4_ * 0xf] =
               dy + _ref_private_macro_code_rxs_2->real[endptr_2._4_4_ * 0xf];
          iVar6 = endptr_2._4_4_ * 0xf + 1;
          _ref_private_macro_code_rxs_2->real[iVar6] =
               dz + _ref_private_macro_code_rxs_2->real[iVar6];
          iVar6 = endptr_2._4_4_ * 0xf + 2;
          _ref_private_macro_code_rxs_2->real[iVar6] =
               (double)ref_node_1 + _ref_private_macro_code_rxs_2->real[iVar6];
        }
      }
    }
    endptr_2._0_4_ = ref_args_find(argv_local._4_4_,(char **)out_file,"--rotatey",&surface_only);
    if (((uint)endptr_2 != 0) && ((uint)endptr_2 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10a5,"translate",(ulong)(uint)endptr_2,"arg search");
      return (uint)endptr_2;
    }
    if (surface_only != -1) {
      pRStack_d8 = _extrude->node;
      if (argv_local._4_4_ <= surface_only + 1) {
        if (pRStack_18->id == 0) {
          printf("--rotatey missing degrees\n");
        }
        goto LAB_00123973;
      }
      surface_only = surface_only + 1;
      rad = strtod(*(char **)(out_file + (long)surface_only * 8),(char **)&degree);
      if (*(REF_DBL *)(out_file + (long)surface_only * 8) == degree) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x10b1,"translate","parse degree");
        return 1;
      }
      ref_node_2 = (REF_NODE)((rad / 180.0) * 3.14159265358979);
      if (pRStack_18->id == 0) {
        printf("--rotatex %f degree %f radian\n",rad);
      }
      for (x._4_4_ = 0; x._4_4_ < pRStack_d8->max; x._4_4_ = x._4_4_ + 1) {
        if (((-1 < x._4_4_) && (x._4_4_ < pRStack_d8->max)) && (-1 < pRStack_d8->global[x._4_4_])) {
          dVar1 = pRStack_d8->real[x._4_4_ * 0xf];
          z = pRStack_d8->real[x._4_4_ * 0xf + 1];
          _group = pRStack_d8->real[x._4_4_ * 0xf + 2];
          y = dVar1;
          dVar7 = cos((double)ref_node_2);
          dVar9 = _group;
          dVar8 = sin((double)ref_node_2);
          RVar3 = y;
          pRStack_d8->real[x._4_4_ * 0xf] = dVar1 * dVar7 + -(dVar9 * dVar8);
          pRStack_d8->real[x._4_4_ * 0xf + 1] = z;
          dVar9 = sin((double)ref_node_2);
          dVar1 = _group;
          dVar7 = cos((double)ref_node_2);
          pRStack_d8->real[x._4_4_ * 0xf + 2] = RVar3 * dVar9 + dVar1 * dVar7;
        }
      }
    }
    ref_cell._4_4_ = ref_args_find(argv_local._4_4_,(char **)out_file,"--surface",&surface_only);
    if ((ref_cell._4_4_ != 0) && (ref_cell._4_4_ != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10c1,"translate",(ulong)ref_cell._4_4_,"arg search");
      return ref_cell._4_4_;
    }
    if (surface_only != -1) {
      if (pRStack_18->id == 0) {
        printf("  --surface deleting 3D cells\n");
      }
      end_of_string._4_4_ = 1;
      ref_cell._0_4_ = REF_CELL_TET;
      _ref_private_macro_code_rss_3 = _extrude->cell[8];
      while ((int)(REF_CELL_TYPE)ref_cell < 0x10) {
        ref_private_macro_code_rxs_4 = ref_cell_free(_ref_private_macro_code_rss_3);
        if (ref_private_macro_code_rxs_4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x10c8,"translate",(ulong)(uint)ref_private_macro_code_rxs_4,"free cell");
          return ref_private_macro_code_rxs_4;
        }
        ref_private_macro_code_rss_4 =
             ref_cell_create(_extrude->cell + (int)(REF_CELL_TYPE)ref_cell,(REF_CELL_TYPE)ref_cell);
        if (ref_private_macro_code_rss_4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x10cb,"translate",(ulong)(uint)ref_private_macro_code_rss_4,"empty cell create");
          return ref_private_macro_code_rss_4;
        }
        ref_cell._0_4_ = (REF_CELL_TYPE)ref_cell + REF_CELL_ED2;
        _ref_private_macro_code_rss_3 = _extrude->cell[(int)(REF_CELL_TYPE)ref_cell];
        ref_private_macro_code_rss_4 = 0;
      }
    }
    ref_private_macro_code_rxs_5 =
         ref_args_find(argv_local._4_4_,(char **)out_file,"--orient",&surface_only);
    if ((ref_private_macro_code_rxs_5 != 0) && (ref_private_macro_code_rxs_5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10d0,"translate",(ulong)(uint)ref_private_macro_code_rxs_5,"arg search");
      return ref_private_macro_code_rxs_5;
    }
    if (surface_only != -1) {
      if (pRStack_18->id == 0) {
        printf("  --orient twod in place\n");
      }
      ref_private_macro_code_rss_5 = ref_grid_orient_twod(_extrude);
      if (ref_private_macro_code_rss_5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x10d3,"translate",(ulong)(uint)ref_private_macro_code_rss_5,"orient twod");
        return ref_private_macro_code_rss_5;
      }
      ref_private_macro_code_rss_5 = 0;
    }
    ref_private_macro_code_rxs_6 =
         ref_args_find(argv_local._4_4_,(char **)out_file,"--shard",&surface_only);
    if ((ref_private_macro_code_rxs_6 != 0) && (ref_private_macro_code_rxs_6 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10d6,"translate",(ulong)(uint)ref_private_macro_code_rxs_6,"arg search");
      return ref_private_macro_code_rxs_6;
    }
    if (surface_only != -1) {
      if (pRStack_18->id == 0) {
        printf("  --shard in place\n");
      }
      ref_private_macro_code_rss_6 = ref_shard_in_place(_extrude);
      if (ref_private_macro_code_rss_6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x10d9,"translate",(ulong)(uint)ref_private_macro_code_rss_6,"shard to simplex");
        return ref_private_macro_code_rss_6;
      }
      ref_private_macro_code_rss_6 = 0;
    }
    ref_private_macro_code_rxs_7 =
         ref_args_find(argv_local._4_4_,(char **)out_file,"--blockhead",&surface_only);
    if ((ref_private_macro_code_rxs_7 != 0) && (ref_private_macro_code_rxs_7 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10dd,"translate",(ulong)(uint)ref_private_macro_code_rxs_7,"arg search");
      return ref_private_macro_code_rxs_7;
    }
    if (surface_only != -1) {
      if (pRStack_18->id == 0) {
        printf("  --blockhead in place\n");
      }
      ref_private_macro_code_rss_7 = ref_subdiv_to_hex(_extrude);
      if (ref_private_macro_code_rss_7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x10e0,"translate",(ulong)(uint)ref_private_macro_code_rss_7,"shard to simplex");
        return ref_private_macro_code_rss_7;
      }
      ref_private_macro_code_rss_7 = 0;
    }
    ref_private_macro_code_rxs_8 =
         ref_args_find(argv_local._4_4_,(char **)out_file,"--enrich2",&surface_only);
    if ((ref_private_macro_code_rxs_8 != 0) && (ref_private_macro_code_rxs_8 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10e4,"translate",(ulong)(uint)ref_private_macro_code_rxs_8,"arg search");
      return ref_private_macro_code_rxs_8;
    }
    if (surface_only != -1) {
      if (pRStack_18->id == 0) {
        printf("  --enrich2\n");
      }
      ref_private_macro_code_rxs_9 = ref_geom_enrich2(_extrude);
      if (ref_private_macro_code_rxs_9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x10e7,"translate",(ulong)(uint)ref_private_macro_code_rxs_9,"enrich to q2");
        return ref_private_macro_code_rxs_9;
      }
      ref_private_macro_code_rxs_9 = 0;
    }
    twod_grid._4_4_ = ref_args_find(argv_local._4_4_,(char **)out_file,"--extrude",&surface_only);
    if ((twod_grid._4_4_ != 0) && (twod_grid._4_4_ != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10eb,"translate",(ulong)twod_grid._4_4_,"arg search");
      return twod_grid._4_4_;
    }
    if (surface_only != -1) {
      local_48 = 1;
    }
    twod_grid._0_4_ = ref_args_find(argv_local._4_4_,(char **)out_file,"--planes",&surface_only);
    if (((uint)twod_grid != 0) && ((uint)twod_grid != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10f0,"translate",(ulong)(uint)twod_grid,"arg search");
      return (uint)twod_grid;
    }
    if ((surface_only == -1) || (local_48 == 0)) {
      if (surface_only == -1) {
        _ref_private_macro_code_rss_1 = strlen(in_file);
        if ((((_extrude->twod != 0) && (5 < _ref_private_macro_code_rss_1)) &&
            (iVar6 = strncmp(in_file + (_ref_private_macro_code_rss_1 - 6),".ugrid",6), iVar6 == 0))
           && (local_48 = 1, pRStack_18->id == 0)) {
          printf("  --extrude implicitly added to ugrid output of 2D input.\n");
        }
      }
      else {
        _ref_private_macro_code_rss_8 = _extrude;
        if (argv_local._4_4_ <= surface_only + 1) {
          if (pRStack_18->id == 0) {
            printf("--planes missing N\n");
          }
          goto LAB_00123973;
        }
        ref_private_macro_code_rss_9 = atoi(*(char **)(out_file + (long)(surface_only + 1) * 8));
        if (ref_private_macro_code_rss_9 < 2) {
          if (pRStack_18->id == 0) {
            printf("--planes %d must be 2 or more\n",(ulong)(uint)ref_private_macro_code_rss_9);
          }
          goto LAB_00123973;
        }
        if (pRStack_18->id == 0) {
          printf("extrude %d layers of prisms\n",(ulong)(uint)ref_private_macro_code_rss_9);
        }
        local_148 = ref_grid_extrude_twod
                              ((REF_GRID *)&extrude,_ref_private_macro_code_rss_8,
                               ref_private_macro_code_rss_9);
        if (local_148 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1104,"translate",(ulong)local_148,"extrude");
          return local_148;
        }
        twod_grid_1._4_4_ = ref_grid_free(_ref_private_macro_code_rss_8);
        if (twod_grid_1._4_4_ != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1105,"translate",(ulong)twod_grid_1._4_4_,"free");
          return twod_grid_1._4_4_;
        }
        twod_grid_1._4_4_ = 0;
      }
      if (local_48 != 0) {
        _ref_private_macro_code_rss_11 = _extrude;
        if (pRStack_18->id == 0) {
          printf("extrude prisms\n");
        }
        ref_private_macro_code_rxs_10 =
             ref_grid_extrude_twod((REF_GRID *)&extrude,_ref_private_macro_code_rss_11,2);
        if (ref_private_macro_code_rxs_10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1113,"translate",(ulong)(uint)ref_private_macro_code_rxs_10,"extrude");
          return ref_private_macro_code_rxs_10;
        }
        local_160 = ref_grid_free(_ref_private_macro_code_rss_11);
        if (local_160 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1114,"translate",(ulong)local_160,"free");
          return local_160;
        }
        local_160 = 0;
      }
      deviation._4_4_ =
           ref_args_find(argv_local._4_4_,(char **)out_file,"--zero-y-face",&surface_only);
      if ((deviation._4_4_ != 0) && (deviation._4_4_ != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1118,"translate",(ulong)deviation._4_4_,"arg search");
        return deviation._4_4_;
      }
      if (surface_only != -1) {
        pRVar2 = _extrude->node;
        if (argv_local._4_4_ <= surface_only + 1) {
          if (pRStack_18->id == 0) {
            printf("--zero-y-face missing faceid\n");
          }
          goto LAB_00123973;
        }
        uVar4 = atoi(*(char **)(out_file + (long)(surface_only + 1) * 8));
        if (pRStack_18->id == 0) {
          printf("zero y of face %d\n",(ulong)uVar4);
        }
        total_deviation = 0.0;
        node_3 = 3;
        ref_node_3 = (REF_NODE)_extrude->cell[3];
        while (node_3 < 8) {
          for (local_194 = 0; local_194 < *(int *)((long)&ref_node_3->part + 4);
              local_194 = local_194 + 1) {
            RVar5 = ref_cell_nodes((REF_CELL)ref_node_3,local_194,&ref_private_macro_code_rxs_11);
            if ((RVar5 == 0) &&
               (uVar4 == (&ref_private_macro_code_rxs_11)[*(int *)&ref_node_3->field_0xc])) {
              for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)&ref_node_3->field_0xc;
                  nodes[0x1a] = nodes[0x1a] + 1) {
                if (pRVar2->real[(&ref_private_macro_code_rxs_11)[nodes[0x1a]] * 0xf + 1] <= 0.0) {
                  local_260 = -pRVar2->real[(&ref_private_macro_code_rxs_11)[nodes[0x1a]] * 0xf + 1]
                  ;
                }
                else {
                  local_260 = pRVar2->real[(&ref_private_macro_code_rxs_11)[nodes[0x1a]] * 0xf + 1];
                }
                if (total_deviation <= local_260) {
                  if (pRVar2->real[(&ref_private_macro_code_rxs_11)[nodes[0x1a]] * 0xf + 1] <= 0.0)
                  {
                    local_270 = -pRVar2->real
                                 [(&ref_private_macro_code_rxs_11)[nodes[0x1a]] * 0xf + 1];
                  }
                  else {
                    local_270 = pRVar2->real
                                [(&ref_private_macro_code_rxs_11)[nodes[0x1a]] * 0xf + 1];
                  }
                  local_268 = local_270;
                }
                else {
                  local_268 = total_deviation;
                }
                total_deviation = local_268;
                pRVar2->real[(&ref_private_macro_code_rxs_11)[nodes[0x1a]] * 0xf + 1] = 0.0;
              }
            }
          }
          node_3 = node_3 + 1;
          ref_node_3 = (REF_NODE)_extrude->cell[node_3];
        }
        uVar4 = ref_mpi_max(pRStack_18,&total_deviation,&ref_cell_1,3);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1131,"translate",(ulong)uVar4,"mpi max");
          return uVar4;
        }
        if (pRStack_18->id == 0) {
          printf("max deviation %e\n",total_deviation);
        }
      }
      uVar4 = ref_args_find(argv_local._4_4_,(char **)out_file,"--axi",&surface_only);
      if ((uVar4 != 0) && (uVar4 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1135,"translate",(ulong)uVar4,"arg search");
        return uVar4;
      }
      if (surface_only != -1) {
        if (pRStack_18->id == 0) {
          printf("--axi creates wedge about y=z=0 axis\n");
        }
        uVar4 = ref_axi_wedge(_extrude);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1138,"translate",(ulong)uVar4,"wedge");
          return uVar4;
        }
      }
      if (pRStack_18->n < 2) {
        if (end_of_string._4_4_ == 0) {
          if (pRStack_18->id == 0) {
            printf("export %ld nodes to %s\n",_extrude->node->old_n_global,in_file);
          }
        }
        else if (pRStack_18->id == 0) {
          printf("export surface to %s\n",in_file);
        }
        uVar4 = ref_export_by_extension(_extrude,in_file);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x114d,"translate",(ulong)uVar4,"export");
          return uVar4;
        }
        ref_mpi_stopwatch_stop(pRStack_18,"export");
      }
      else {
        if (end_of_string._4_4_ == 0) {
          if (pRStack_18->id == 0) {
            printf("gather %ld nodes to %s\n",_extrude->node->old_n_global,in_file);
          }
        }
        else if (pRStack_18->id == 0) {
          printf("gather surface to %s\n",in_file);
        }
        uVar4 = ref_gather_by_extension(_extrude,in_file);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1143,"translate",(ulong)uVar4,"gather");
          return uVar4;
        }
        ref_mpi_stopwatch_stop(pRStack_18,"gather");
      }
      uVar4 = ref_grid_free(_extrude);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1151,"translate",(ulong)uVar4,"free grid");
        return uVar4;
      }
      return 0;
    }
    if (pRStack_18->id == 0) {
      printf("--extrude and --planes exclusive\n");
    }
  }
LAB_00123973:
  if (pRStack_18->id == 0) {
    translate_help(*(char **)out_file);
  }
  return 1;
}

Assistant:

static REF_STATUS translate(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *out_file;
  char *in_file;
  REF_GRID ref_grid = NULL;
  REF_INT pos;
  REF_BOOL extrude = REF_FALSE;
  REF_BOOL surface_only = REF_FALSE;
  size_t end_of_string;

  if (argc < 4) goto shutdown;
  in_file = argv[2];
  out_file = argv[3];

  ref_mpi_stopwatch_start(ref_mpi);

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", in_file);
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, in_file), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "part");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", in_file);
    RSS(ref_import_by_extension(&ref_grid, ref_mpi, in_file), "import");
    ref_mpi_stopwatch_stop(ref_mpi, "import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(ref_grid)));

  RXS(ref_args_find(argc, argv, "--scale", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    char *endptr;
    REF_DBL scale;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--scale missing scale\n");
      goto shutdown;
    }
    pos++;
    scale = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse scale");
    if (ref_mpi_once(ref_mpi)) printf("--scale %e\n", scale);
    each_ref_node_valid_node(ref_node, node) {
      ref_node_xyz(ref_node, 0, node) *= scale;
      ref_node_xyz(ref_node, 1, node) *= scale;
      ref_node_xyz(ref_node, 2, node) *= scale;
    }
  }

  RXS(ref_args_find(argc, argv, "--shift", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    char *endptr;
    REF_DBL dx, dy, dz;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    if (pos + 3 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--shift missing dx dy dz\n");
      goto shutdown;
    }
    pos++;
    dx = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse dx");
    pos++;
    dy = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse dy");
    pos++;
    dz = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse dz");
    if (ref_mpi_once(ref_mpi)) printf("--shift %e %e %e\n", dx, dy, dz);
    each_ref_node_valid_node(ref_node, node) {
      ref_node_xyz(ref_node, 0, node) += dx;
      ref_node_xyz(ref_node, 1, node) += dy;
      ref_node_xyz(ref_node, 2, node) += dz;
    }
  }

  RXS(ref_args_find(argc, argv, "--rotatey", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    char *endptr;
    REF_DBL degree, rad;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--rotatey missing degrees\n");
      goto shutdown;
    }
    pos++;
    degree = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse degree");
    rad = ref_math_in_radians(degree);
    if (ref_mpi_once(ref_mpi))
      printf("--rotatex %f degree %f radian\n", degree, rad);
    each_ref_node_valid_node(ref_node, node) {
      REF_DBL x, y, z;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      z = ref_node_xyz(ref_node, 2, node);
      ref_node_xyz(ref_node, 0, node) = x * cos(rad) - z * sin(rad);
      ref_node_xyz(ref_node, 1, node) = y;
      ref_node_xyz(ref_node, 2, node) = x * sin(rad) + z * cos(rad);
    }
  }

  RXS(ref_args_find(argc, argv, "--surface", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    REF_INT group;
    REF_CELL ref_cell;
    if (ref_mpi_once(ref_mpi)) printf("  --surface deleting 3D cells\n");
    surface_only = REF_TRUE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_free(ref_cell), "free cell");
      RSS(ref_cell_create(&ref_grid_cell(ref_grid, group),
                          (REF_CELL_TYPE)group),
          "empty cell create");
      ref_cell = ref_grid_cell(ref_grid, group);
    }
  }

  RXS(ref_args_find(argc, argv, "--orient", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --orient twod in place\n");
    RSS(ref_grid_orient_twod(ref_grid), "orient twod");
  }

  RXS(ref_args_find(argc, argv, "--shard", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --shard in place\n");
    RSS(ref_shard_in_place(ref_grid), "shard to simplex");
  }

  RXS(ref_args_find(argc, argv, "--blockhead", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --blockhead in place\n");
    RSS(ref_subdiv_to_hex(ref_grid), "shard to simplex");
  }

  RXS(ref_args_find(argc, argv, "--enrich2", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --enrich2\n");
    RSS(ref_geom_enrich2(ref_grid), "enrich to q2");
  }

  RXS(ref_args_find(argc, argv, "--extrude", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    extrude = REF_TRUE;
  }

  RXS(ref_args_find(argc, argv, "--planes", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && extrude) {
    if (ref_mpi_once(ref_mpi)) printf("--extrude and --planes exclusive\n");
    goto shutdown;
  }
  if (REF_EMPTY != pos) {
    REF_GRID twod_grid = ref_grid;
    REF_INT n_planes;
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--planes missing N\n");
      goto shutdown;
    }
    n_planes = atoi(argv[pos + 1]);
    if (n_planes < 2) {
      if (ref_mpi_once(ref_mpi))
        printf("--planes %d must be 2 or more\n", n_planes);
      goto shutdown;
    }
    if (ref_mpi_once(ref_mpi))
      printf("extrude %d layers of prisms\n", n_planes);
    RSS(ref_grid_extrude_twod(&ref_grid, twod_grid, n_planes), "extrude");
    RSS(ref_grid_free(twod_grid), "free");
  } else {
    end_of_string = strlen(out_file);
    if (ref_grid_twod(ref_grid) && (end_of_string >= 6) &&
        (strncmp(&out_file[end_of_string - 6], ".ugrid", 6)) == 0) {
      extrude = REF_TRUE;
      if (ref_mpi_once(ref_mpi))
        printf("  --extrude implicitly added to ugrid output of 2D input.\n");
    }
  }

  if (extrude) {
    REF_GRID twod_grid = ref_grid;
    if (ref_mpi_once(ref_mpi)) printf("extrude prisms\n");
    RSS(ref_grid_extrude_twod(&ref_grid, twod_grid, 2), "extrude");
    RSS(ref_grid_free(twod_grid), "free");
  }

  RXS(ref_args_find(argc, argv, "--zero-y-face", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    REF_DBL deviation, total_deviation;
    REF_CELL ref_cell;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT faceid, group, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--zero-y-face missing faceid\n");
      goto shutdown;
    }
    faceid = atoi(argv[pos + 1]);
    if (ref_mpi_once(ref_mpi)) printf("zero y of face %d\n", faceid);
    deviation = 0.0;
    each_ref_grid_2d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (faceid == nodes[ref_cell_node_per(ref_cell)]) {
          each_ref_cell_cell_node(ref_cell, node) {
            deviation =
                MAX(deviation, ABS(ref_node_xyz(ref_node, 1, nodes[node])));
            ref_node_xyz(ref_node, 1, nodes[node]) = 0.0;
          }
        }
      }
    }
    RSS(ref_mpi_max(ref_mpi, &deviation, &total_deviation, REF_DBL_TYPE),
        "mpi max");
    if (ref_mpi_once(ref_mpi)) printf("max deviation %e\n", deviation);
  }

  RXS(ref_args_find(argc, argv, "--axi", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("--axi creates wedge about y=z=0 axis\n");
    RSS(ref_axi_wedge(ref_grid), "wedge");
  }

  if (ref_mpi_para(ref_mpi)) {
    if (surface_only) {
      if (ref_mpi_once(ref_mpi)) printf("gather surface to %s\n", out_file);
    } else {
      if (ref_mpi_once(ref_mpi))
        printf("gather " REF_GLOB_FMT " nodes to %s\n",
               ref_node_n_global(ref_grid_node(ref_grid)), out_file);
    }
    RSS(ref_gather_by_extension(ref_grid, out_file), "gather");
    ref_mpi_stopwatch_stop(ref_mpi, "gather");
  } else {
    if (surface_only) {
      if (ref_mpi_once(ref_mpi)) printf("export surface to %s\n", out_file);
    } else {
      if (ref_mpi_once(ref_mpi))
        printf("export " REF_GLOB_FMT " nodes to %s\n",
               ref_node_n_global(ref_grid_node(ref_grid)), out_file);
    }
    RSS(ref_export_by_extension(ref_grid, out_file), "export");
    ref_mpi_stopwatch_stop(ref_mpi, "export");
  }

  RSS(ref_grid_free(ref_grid), "free grid");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) translate_help(argv[0]);
  return REF_FAILURE;
}